

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgkyn(fitsfile *fptr,int nkey,char *keyname,char *value,char *comm,int *status)

{
  int iVar1;
  undefined1 *in_RCX;
  undefined1 *in_RDX;
  uint in_ESI;
  undefined1 *in_R8;
  int *in_R9;
  int namelen;
  char sbuff [81];
  char card [81];
  char *in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff04;
  fitsfile *in_stack_ffffffffffffff08;
  int *in_stack_ffffffffffffff20;
  int *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  int *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  int *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  int local_4;
  
  *in_RDX = 0;
  *in_RCX = 0;
  if (in_R8 != (undefined1 *)0x0) {
    *in_R8 = 0;
  }
  if (*in_R9 < 1) {
    iVar1 = ffgrec(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_fffffffffffffef8,
                   (int *)0x1d4276);
    if (iVar1 < 1) {
      ffgknm(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             in_stack_ffffffffffffff20);
      iVar1 = ffpsvc(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                     in_stack_ffffffffffffff80);
      if (iVar1 < 1) {
        iVar1 = fftrec(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
        if (0 < iVar1) {
          snprintf(&stack0xffffffffffffff08,0x51,
                   "Name of keyword no. %d contains illegal character(s): %s",(ulong)in_ESI,in_RDX);
          ffpmsg((char *)0x1d4335);
          if ((int)in_ESI % 0x24 == 0) {
            ffpmsg((char *)0x1d4355);
          }
        }
        local_4 = *in_R9;
      }
      else {
        local_4 = *in_R9;
      }
    }
    else {
      local_4 = *in_R9;
    }
  }
  else {
    local_4 = *in_R9;
  }
  return local_4;
}

Assistant:

int ffgkyn( fitsfile *fptr,      /* I - FITS file pointer             */
            int    nkey,         /* I - number of the keyword to read */
            char   *keyname,     /* O - name of the keyword           */
            char   *value,       /* O - keyword value                 */
            char   *comm,        /* O - keyword comment               */
            int    *status)      /* IO - error status                 */
/*
  Read (get) the nkey-th keyword returning the keyword name, value and comment.
  The value is just the literal string of characters in the value field
  of the keyword.  In the case of a string valued keyword, the returned
  value includes the leading and closing quote characters.  The value may be
  up to 70 characters long, and the comment may be up to 72 characters long.
  If the keyword has no value (no equal sign in column 9) then a null value
  is returned.  If comm = NULL, then do not return the comment string.
*/
{
    char card[FLEN_CARD], sbuff[FLEN_CARD];
    int namelen;

    keyname[0] = '\0';
    value[0] = '\0';
    if (comm)
        comm[0] = '\0';

    if (*status > 0)
        return(*status);

    if (ffgrec(fptr, nkey, card, status) > 0 )  /* get the 80-byte card */
        return(*status);

    ffgknm(card, keyname, &namelen, status); /* get the keyword name */

    if (ffpsvc(card, value, comm, status) > 0)   /* parse value and comment */
        return(*status);

    if (fftrec(keyname, status) > 0)  /* test keyword name; catches no END */
    {
     snprintf(sbuff, FLEN_CARD, "Name of keyword no. %d contains illegal character(s): %s",
              nkey, keyname);
     ffpmsg(sbuff);

     if (nkey % 36 == 0)  /* test if at beginning of 36-card FITS record */
            ffpmsg("  (This may indicate a missing END keyword).");
    }
    return(*status);
}